

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlmaster.c
# Opt level: O2

bool_t EBML_MasterCheckMandatory(ebml_master *Element,bool_t bWithDefault,int ForProfile)

{
  ebml_master *peVar1;
  bool_t bVar2;
  bool_t bVar3;
  ebml_master *Element_00;
  bool bVar4;
  
  bVar2 = CheckMandatory(Element,bWithDefault,ForProfile);
  if (bVar2 == 0) {
LAB_0011224d:
    bVar2 = 0;
  }
  else {
    bVar2 = 1;
    Element_00 = (ebml_master *)(Element->Base).Base.Children;
    while (Element_00 != (ebml_master *)0x0) {
      bVar3 = Node_IsPartOf(Element_00,0x544d4245);
      if (bVar3 != 0) {
        bVar3 = EBML_MasterCheckMandatory(Element_00,bWithDefault,ForProfile);
        if (bVar3 == 0) goto LAB_0011224d;
      }
      peVar1 = (ebml_master *)(Element_00->Base).Base.Next;
      bVar4 = Element_00 == peVar1;
      Element_00 = peVar1;
      if (bVar4) {
        __assert_fail("(nodetree*)(Child) != ((nodetree*)(Child))->Next",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmaster.c"
                      ,0xbe,"bool_t EBML_MasterCheckMandatory(const ebml_master *, bool_t, int)");
      }
    }
  }
  return bVar2;
}

Assistant:

bool_t EBML_MasterCheckMandatory(const ebml_master *Element, bool_t bWithDefault, int ForProfile)
{
	ebml_element *Child;
	if (!CheckMandatory(Element, bWithDefault, ForProfile))
		return 0;

	for (Child = EBML_MasterChildren(Element); Child; Child = EBML_MasterNext(Child))
	{
		if (Node_IsPartOf(Child,EBML_MASTER_CLASS) && !EBML_MasterCheckMandatory((ebml_master*)Child, bWithDefault, ForProfile))
			return 0;
	}
    return 1;
}